

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O2

DIR * __thiscall pstore::romfs::romfs::opendir(romfs *this,char *__name)

{
  not_null<const_pstore::romfs::dirent_*> *pnVar1;
  not_null<const_char_*> in_RDX;
  error_category *peVar2;
  ulong uVar3;
  error_code eVar4;
  error_code erc;
  error_or<const_pstore::romfs::directory_*> local_80;
  error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_> local_68;
  shared_ptr<pstore::romfs::open_directory> directory;
  __shared_ptr<pstore::romfs::open_directory,_(__gnu_cxx::_Lock_policy)2> local_38;
  dirent_descriptor local_28;
  
  parse_path(&local_68,(romfs *)__name,in_RDX);
  if (local_68.has_error_ == false) {
    pnVar1 = error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>::
             value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>&,pstore::gsl::not_null<pstore::romfs::dirent_const*>>
                       (&local_68);
    if ((pnVar1->ptr_->stat_).mode == directory) {
      dirent::opendir((dirent *)&directory,(char *)pnVar1->ptr_);
      error_or<pstore::romfs::directory_const*>::
      error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>,void>
                (&local_80,
                 (error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)&directory);
      error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>::~error_or
                ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)&directory);
      goto LAB_0011d941;
    }
    get_romfs_error_category();
    peVar2 = &get_romfs_error_category::cat;
    uVar3 = 0x14;
  }
  else {
    eVar4 = error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_>::get_error(&local_68);
    peVar2 = (error_category *)eVar4._M_cat;
    uVar3 = (ulong)(uint)eVar4._M_value;
  }
  eVar4._M_cat = &peVar2->super_error_category;
  eVar4._0_8_ = uVar3;
  error_or<const_pstore::romfs::directory_*>::error_or(&local_80,eVar4);
LAB_0011d941:
  if (local_80.has_error_ == false) {
    error_or<pstore::romfs::directory_const*>::
    value_storage_impl<pstore::error_or<pstore::romfs::directory_const*>&,pstore::romfs::directory_const*>
              (&local_80);
    std::make_shared<pstore::romfs::open_directory,pstore::romfs::directory_const&>
              ((directory *)&directory);
    std::__shared_ptr<pstore::romfs::open_directory,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,
               &directory.
                super___shared_ptr<pstore::romfs::open_directory,_(__gnu_cxx::_Lock_policy)2>);
    local_28.f_.super___shared_ptr<pstore::romfs::open_directory,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = local_38._M_ptr;
    local_28.f_.super___shared_ptr<pstore::romfs::open_directory,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_38._M_refcount._M_pi;
    local_38._M_ptr = (element_type *)0x0;
    local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    error_or<pstore::romfs::dirent_descriptor>::error_or<pstore::romfs::dirent_descriptor,void>
              ((error_or<pstore::romfs::dirent_descriptor> *)this,&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_28.f_.
                super___shared_ptr<pstore::romfs::open_directory,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&directory.
                super___shared_ptr<pstore::romfs::open_directory,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    eVar4 = error_or<const_pstore::romfs::directory_*>::get_error(&local_80);
    erc._M_cat = eVar4._M_cat;
    erc._4_4_ = 0;
    erc._M_value = eVar4._M_value;
    error_or<pstore::romfs::dirent_descriptor>::error_or
              ((error_or<pstore::romfs::dirent_descriptor> *)this,erc);
  }
  error_or<const_pstore::romfs::directory_*>::~error_or(&local_80);
  error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_>::~error_or(&local_68);
  return (DIR *)this;
}

Assistant:

error_or<dirent_descriptor> romfs::opendir (not_null<czstring> const path) {
            auto get_directory = [] (dirent const * const de) {
                using rett = error_or<directory const *>;
                return de->is_directory () ? rett{de->opendir ()}
                                           : rett{make_error_code (error_code::enotdir)};
            };

            auto create_descriptor = [] (directory const * const d) {
                auto const directory = std::make_shared<open_directory> (*d);
                return error_or<dirent_descriptor>{dirent_descriptor{directory}};
            };

            return (this->parse_path (path) >>= get_directory) >>= create_descriptor;
        }